

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader14.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::SourceArrayLoader14::begin__accessor(SourceArrayLoader14 *this)

{
  accessor__AttributeData *in_RSI;
  
  begin__accessor((SourceArrayLoader14 *)&this[-1].super_IParserImpl14.super_ColladaParserAutoGen14,
                  in_RSI);
  return;
}

Assistant:

bool SourceArrayLoader14::begin__accessor( const COLLADASaxFWL14::accessor__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__accessor(attributeData));
COLLADASaxFWL::accessor__AttributeData attrData;
attrData.present_attributes = 0;
attrData.offset = attributeData.offset;
attrData.stride = attributeData.stride;
if ( (attributeData.present_attributes & COLLADASaxFWL14::accessor__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL14::accessor__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::accessor__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL14::accessor__AttributeData::ATTRIBUTE_SOURCE_PRESENT) == COLLADASaxFWL14::accessor__AttributeData::ATTRIBUTE_SOURCE_PRESENT ) {
    attrData.source = attributeData.source;
    attrData.present_attributes |= COLLADASaxFWL::accessor__AttributeData::ATTRIBUTE_SOURCE_PRESENT;
}
return mLoader->begin__accessor(attrData);
}